

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool gen_shift(DisasContext_conflict12 *ctx,arg_r_conflict *a,
               _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_conflict11 *func)

{
  TCGContext_conflict11 *s;
  undefined1 extraout_AL;
  TCGTemp *a1;
  TCGTemp *a1_00;
  uintptr_t o;
  TCGv_i64 pTVar1;
  TCGv_i64 a2;
  uintptr_t o_4;
  TCGOpcode TVar2;
  uintptr_t o_3;
  TCGv_i64 pTVar3;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  pTVar3 = (TCGv_i64)((long)a1 - (long)s);
  a1_00 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  if ((long)a->rs1 == 0) {
    TVar2 = INDEX_op_movi_i64;
    pTVar1 = (TCGv_i64)0x0;
LAB_00c7f70f:
    tcg_gen_op2_riscv64(s,TVar2,(TCGArg)a1,(TCGArg)pTVar1);
  }
  else if (s->cpu_gpr[a->rs1] != pTVar3) {
    pTVar1 = s->cpu_gpr[a->rs1] + (long)s;
    TVar2 = INDEX_op_mov_i64;
    goto LAB_00c7f70f;
  }
  pTVar1 = (TCGv_i64)((long)a1_00 - (long)s);
  if ((long)a->rs2 == 0) {
    TVar2 = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
  }
  else {
    if (s->cpu_gpr[a->rs2] == pTVar1) goto LAB_00c7f753;
    a2 = s->cpu_gpr[a->rs2] + (long)s;
    TVar2 = INDEX_op_mov_i64;
  }
  tcg_gen_op2_riscv64(s,TVar2,(TCGArg)a1_00,(TCGArg)a2);
LAB_00c7f753:
  tcg_gen_andi_i64_riscv64(s,pTVar1,pTVar1,0x3f);
  (*func)(s,pTVar3,pTVar3,pTVar1);
  if (((long)a->rd != 0) && (s->cpu_gpr[a->rd] != pTVar3)) {
    tcg_gen_op2_riscv64(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[a->rd] + (long)s),(TCGArg)a1);
  }
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(pTVar3 + (long)s));
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(pTVar1 + (long)s));
  return (_Bool)extraout_AL;
}

Assistant:

static void gen_shift(DisasContext *ctx, uint32_t opc,
                      int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;

    if (rd == 0) {
        /*
         * If no destination, treat it as a NOP.
         * For add & sub, we must generate the overflow exception when needed.
         */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);
    switch (opc) {
    case OPC_SLLV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x1f);
        tcg_gen_shl_tl(tcg_ctx, t0, t1, t0);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
        break;
    case OPC_SRAV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x1f);
        tcg_gen_sar_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
        break;
    case OPC_SRLV:
        tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x1f);
        tcg_gen_shr_tl(tcg_ctx, t0, t1, t0);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
        break;
    case OPC_ROTRV:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);

            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_andi_i32(tcg_ctx, t2, t2, 0x1f);
            tcg_gen_rotr_i32(tcg_ctx, t2, t3, t2);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DSLLV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x3f);
        tcg_gen_shl_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
        break;
    case OPC_DSRAV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x3f);
        tcg_gen_sar_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
        break;
    case OPC_DSRLV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x3f);
        tcg_gen_shr_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
        break;
    case OPC_DROTRV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x3f);
        tcg_gen_rotr_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}